

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_operations.cpp
# Opt level: O1

bool duckdb::TemplatedBooleanOperation<duckdb::GreaterThan>(Value *left,Value *right)

{
  PhysicalType PVar1;
  element_type *peVar2;
  element_type *peVar3;
  bool bVar4;
  byte bVar5;
  int8_t iVar6;
  int8_t iVar7;
  int16_t iVar8;
  int16_t iVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  int32_t iVar12;
  int32_t iVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  int iVar16;
  vector<duckdb::Value,_true> *pvVar17;
  vector<duckdb::Value,_true> *pvVar18;
  const_reference pvVar19;
  const_reference pvVar20;
  pointer right_00;
  ulong uVar21;
  int64_t iVar22;
  int64_t iVar23;
  uint64_t uVar24;
  uint64_t uVar25;
  string *psVar26;
  InternalException *this;
  ulong uVar27;
  byte bVar28;
  long lVar29;
  long lVar30;
  size_type sVar31;
  long lVar32;
  long lVar33;
  bool bVar34;
  bool bVar35;
  hugeint_t hVar36;
  hugeint_t hVar37;
  interval_t iVar38;
  interval_t iVar39;
  LogicalType LStack_c8;
  Value local_b0;
  Value local_70;
  
LAB_00e2be56:
  bVar4 = LogicalType::operator==(&left->type_,&right->type_);
  peVar3 = local_70.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  peVar2 = local_b0.type_.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (bVar4) {
    PVar1 = (left->type_).physical_type_;
    local_b0.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
    if (PVar1 < VARCHAR) {
      switch(PVar1) {
      case BOOL:
        bVar4 = Value::GetValueUnsafe<bool>(left);
        bVar34 = Value::GetValueUnsafe<bool>(right);
        bVar28 = !bVar34 && bVar4;
        goto LAB_00e2c4bf;
      case UINT8:
        bVar28 = Value::GetValueUnsafe<unsigned_char>(left);
        bVar5 = Value::GetValueUnsafe<unsigned_char>(right);
        bVar4 = bVar28 < bVar5;
        bVar34 = bVar28 == bVar5;
        goto LAB_00e2c3a7;
      case INT8:
        iVar6 = Value::GetValueUnsafe<signed_char>(left);
        iVar7 = Value::GetValueUnsafe<signed_char>(right);
        bVar35 = SBORROW1(iVar6,iVar7);
        bVar34 = (char)(iVar6 - iVar7) < '\0';
        bVar4 = iVar6 == iVar7;
        break;
      case UINT16:
        uVar10 = Value::GetValueUnsafe<unsigned_short>(left);
        uVar11 = Value::GetValueUnsafe<unsigned_short>(right);
        bVar4 = uVar10 < uVar11;
        bVar34 = uVar10 == uVar11;
        goto LAB_00e2c3a7;
      case INT16:
        iVar8 = Value::GetValueUnsafe<short>(left);
        iVar9 = Value::GetValueUnsafe<short>(right);
        bVar35 = SBORROW2(iVar8,iVar9);
        bVar34 = (short)(iVar8 - iVar9) < 0;
        bVar4 = iVar8 == iVar9;
        break;
      case UINT32:
        uVar14 = Value::GetValueUnsafe<unsigned_int>(left);
        uVar15 = Value::GetValueUnsafe<unsigned_int>(right);
        bVar4 = uVar14 < uVar15;
        bVar34 = uVar14 == uVar15;
        goto LAB_00e2c3a7;
      case INT32:
        iVar12 = Value::GetValueUnsafe<int>(left);
        iVar13 = Value::GetValueUnsafe<int>(right);
        bVar35 = SBORROW4(iVar12,iVar13);
        bVar34 = iVar12 - iVar13 < 0;
        bVar4 = iVar12 == iVar13;
        break;
      case UINT64:
        uVar24 = Value::GetValueUnsafe<unsigned_long>(left);
        uVar25 = Value::GetValueUnsafe<unsigned_long>(right);
        bVar4 = uVar24 < uVar25;
        bVar34 = uVar24 == uVar25;
        goto LAB_00e2c3a7;
      case INT64:
        iVar22 = Value::GetValueUnsafe<long>(left);
        iVar23 = Value::GetValueUnsafe<long>(right);
        bVar35 = SBORROW8(iVar22,iVar23);
        bVar34 = iVar22 - iVar23 < 0;
        bVar4 = iVar22 == iVar23;
        break;
      default:
switchD_00e2be8c_caseD_a:
        this = (InternalException *)__cxa_allocate_exception(0x10);
        local_b0.type_._0_8_ =
             (uhugeint_t *)
             &local_b0.type_.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_b0,"Unimplemented type for value comparison","");
        InternalException::InternalException(this,(string *)&local_b0);
        __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      case FLOAT:
        local_b0.type_._0_4_ = Value::GetValueUnsafe<float>(left);
        local_70.type_._0_4_ = Value::GetValueUnsafe<float>(right);
        bVar28 = GreaterThan::Operation<float>((float *)&local_b0,(float *)&local_70);
        goto LAB_00e2c4bf;
      case DOUBLE:
        local_70.type_.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar3;
        local_b0.type_._0_8_ = Value::GetValueUnsafe<double>(left);
        local_70.type_._0_8_ = Value::GetValueUnsafe<double>(right);
        bVar28 = GreaterThan::Operation<double>((double *)&local_b0,(double *)&local_70);
        goto LAB_00e2c4bf;
      case INTERVAL:
        iVar38 = Value::GetValueUnsafe<duckdb::interval_t>(left);
        iVar39 = Value::GetValueUnsafe<duckdb::interval_t>(right);
        lVar29 = (iVar38._0_8_ >> 0x20) + iVar38.micros / 86400000000;
        lVar33 = (long)iVar38.months + lVar29 / 0x1e;
        lVar30 = (iVar39._0_8_ >> 0x20) + iVar39.micros / 86400000000;
        lVar32 = (long)iVar39.months + lVar30 / 0x1e;
        bVar28 = 1;
        if (lVar33 <= lVar32) {
          if (lVar33 < lVar32) goto LAB_00e2c464;
          lVar29 = lVar29 % 0x1e;
          lVar30 = lVar30 % 0x1e;
          if (lVar29 <= lVar30) {
            bVar28 = iVar39.micros % 86400000000 < iVar38.micros % 86400000000 && lVar30 <= lVar29;
          }
        }
        goto LAB_00e2c4bf;
      case LIST:
        pvVar17 = ListValue::GetChildren(left);
        pvVar18 = ListValue::GetChildren(right);
        uVar21 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_start;
        if ((uVar21 == 0) ||
           ((pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            (pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start)) goto LAB_00e2c24e;
        sVar31 = 0;
        goto LAB_00e2c193;
      case STRUCT:
        pvVar17 = StructValue::GetChildren(left);
        pvVar18 = StructValue::GetChildren(right);
        sVar31 = 0;
        if ((long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start != 0x40) {
          do {
            pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
            pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
            if ((pvVar19->is_null != true) || (pvVar20->is_null == false)) {
              bVar28 = pvVar20->is_null ^ 1;
              if ((pvVar19->is_null == false) && (pvVar20->is_null == false)) {
                bVar28 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20);
              }
              if (bVar28 != 0) goto LAB_00e2c25d;
            }
            pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
            pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
            if (((pvVar19->is_null != true) || (pvVar20->is_null == false)) &&
               ((pvVar19->is_null != pvVar20->is_null ||
                (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,pvVar20), !bVar4))))
            goto LAB_00e2c464;
            sVar31 = sVar31 + 1;
          } while (sVar31 < ((long)(pvVar17->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(pvVar17->
                                   super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 6) - 1U);
        }
        left = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
        right = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
        if ((left->is_null != true) || (right->is_null == false)) goto LAB_00e2bf94;
        goto LAB_00e2c464;
      case ARRAY:
        pvVar17 = ArrayValue::GetChildren(left);
        pvVar18 = ArrayValue::GetChildren(right);
        right_00 = (pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        bVar4 = right_00 ==
                (pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start;
        if (bVar4) goto LAB_00e2c516;
        sVar31 = 0;
        goto LAB_00e2c0ae;
      }
LAB_00e2c4bc:
      bVar28 = !bVar4 && bVar35 == bVar34;
    }
    else {
      if (PVar1 == VARCHAR) {
        psVar26 = StringValue::Get_abi_cxx11_(left);
        StringValue::Get_abi_cxx11_(right);
        iVar16 = ::std::__cxx11::string::compare((string *)psVar26);
        bVar35 = false;
        bVar34 = iVar16 < 0;
        bVar4 = iVar16 == 0;
        goto LAB_00e2c4bc;
      }
      if (PVar1 == UINT128) {
        local_b0.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(left);
        local_70.type_._0_16_ = Value::GetValueUnsafe<duckdb::uhugeint_t>(right);
        bVar28 = uhugeint_t::operator>((uhugeint_t *)&local_b0,(uhugeint_t *)&local_70);
      }
      else {
        if (PVar1 != INT128) goto switchD_00e2be8c_caseD_a;
        hVar36 = Value::GetValueUnsafe<duckdb::hugeint_t>(left);
        lVar30 = hVar36.upper;
        hVar37 = Value::GetValueUnsafe<duckdb::hugeint_t>(right);
        lVar29 = hVar37.upper;
        bVar28 = hVar37.lower < hVar36.lower && lVar30 == lVar29 ||
                 lVar30 != lVar29 && lVar29 <= lVar30;
      }
    }
  }
  else {
    Value::Value(&local_b0,left);
    Value::Value(&local_70,right);
    LogicalType::ForceMaxLogicalType(&LStack_c8,&left->type_,&right->type_);
    bVar4 = Value::DefaultTryCastAs(&local_b0,&LStack_c8,false);
    if ((bVar4) && (bVar4 = Value::DefaultTryCastAs(&local_70,&LStack_c8,false), bVar4)) {
      bVar28 = TemplatedBooleanOperation<duckdb::GreaterThan>(&local_b0,&local_70);
    }
    else {
      bVar28 = false;
    }
    LogicalType::~LogicalType(&LStack_c8);
    Value::~Value(&local_70);
    Value::~Value(&local_b0);
  }
  goto LAB_00e2c4bf;
LAB_00e2c0ae:
  do {
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
    if ((pvVar19->is_null != true) || (pvVar20->is_null == false)) {
      bVar28 = pvVar20->is_null ^ 1;
      if ((pvVar19->is_null == false) && (pvVar20->is_null == false)) {
        bVar28 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20);
      }
      if (bVar28 != 0) {
        right_00 = (pointer)&DAT_00000001;
        break;
      }
    }
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
    right_00 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
    if ((pvVar19->is_null != true) || (right_00->is_null == false)) {
      if (pvVar19->is_null == right_00->is_null) {
        bVar34 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,right_00);
        right_00 = (pointer)(ulong)bVar34;
        if (bVar34) goto LAB_00e2c141;
      }
      right_00 = (pointer)0x0;
      break;
    }
LAB_00e2c141:
    sVar31 = sVar31 + 1;
    bVar34 = sVar31 < (ulong)((long)(pvVar17->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar17->
                                    super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 6);
    bVar4 = !bVar34;
  } while (bVar34);
LAB_00e2c516:
  bVar28 = bVar4 | (byte)right_00;
  goto LAB_00e2c4bf;
LAB_00e2bf94:
  bVar28 = right->is_null ^ 1;
  if ((left->is_null != false) || (right->is_null != false)) goto LAB_00e2c4bf;
  goto LAB_00e2be56;
LAB_00e2c25d:
  bVar28 = 1;
  goto LAB_00e2c4bf;
LAB_00e2c464:
  bVar28 = 0;
  goto LAB_00e2c4bf;
  while( true ) {
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
    if (((pvVar19->is_null != true) || (pvVar20->is_null == false)) &&
       ((pvVar19->is_null != pvVar20->is_null ||
        (bVar4 = TemplatedBooleanOperation<duckdb::Equals>(pvVar19,pvVar20), !bVar4))))
    goto LAB_00e2c464;
    uVar21 = (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pvVar17->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                   super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                   super__Vector_impl_data._M_start;
    sVar31 = sVar31 + 1;
    if ((sVar31 == (long)uVar21 >> 6) ||
       (sVar31 == (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start >> 6)) break;
LAB_00e2c193:
    pvVar19 = vector<duckdb::Value,_true>::operator[](pvVar17,sVar31);
    pvVar20 = vector<duckdb::Value,_true>::operator[](pvVar18,sVar31);
    if ((pvVar19->is_null != true) || (pvVar20->is_null == false)) {
      bVar28 = pvVar20->is_null ^ 1;
      if ((pvVar19->is_null == false) && (pvVar20->is_null == false)) {
        bVar28 = TemplatedBooleanOperation<duckdb::GreaterThan>(pvVar19,pvVar20);
      }
      if (bVar28 != 0) goto LAB_00e2c25d;
    }
  }
LAB_00e2c24e:
  uVar27 = (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(pvVar18->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                 super__Vector_impl_data._M_start;
  bVar4 = uVar21 < uVar27;
  bVar34 = uVar21 == uVar27;
LAB_00e2c3a7:
  bVar28 = !bVar4 && !bVar34;
LAB_00e2c4bf:
  return (bool)(bVar28 & 1);
}

Assistant:

static bool TemplatedBooleanOperation(const Value &left, const Value &right) {
	const auto &left_type = left.type();
	const auto &right_type = right.type();
	if (left_type != right_type) {
		Value left_copy = left;
		Value right_copy = right;

		auto comparison_type = LogicalType::ForceMaxLogicalType(left_type, right_type);
		if (!left_copy.DefaultTryCastAs(comparison_type) || !right_copy.DefaultTryCastAs(comparison_type)) {
			return false;
		}
		D_ASSERT(left_copy.type() == right_copy.type());
		return TemplatedBooleanOperation<OP>(left_copy, right_copy);
	}
	switch (left_type.InternalType()) {
	case PhysicalType::BOOL:
		return OP::Operation(left.GetValueUnsafe<bool>(), right.GetValueUnsafe<bool>());
	case PhysicalType::INT8:
		return OP::Operation(left.GetValueUnsafe<int8_t>(), right.GetValueUnsafe<int8_t>());
	case PhysicalType::INT16:
		return OP::Operation(left.GetValueUnsafe<int16_t>(), right.GetValueUnsafe<int16_t>());
	case PhysicalType::INT32:
		return OP::Operation(left.GetValueUnsafe<int32_t>(), right.GetValueUnsafe<int32_t>());
	case PhysicalType::INT64:
		return OP::Operation(left.GetValueUnsafe<int64_t>(), right.GetValueUnsafe<int64_t>());
	case PhysicalType::UINT8:
		return OP::Operation(left.GetValueUnsafe<uint8_t>(), right.GetValueUnsafe<uint8_t>());
	case PhysicalType::UINT16:
		return OP::Operation(left.GetValueUnsafe<uint16_t>(), right.GetValueUnsafe<uint16_t>());
	case PhysicalType::UINT32:
		return OP::Operation(left.GetValueUnsafe<uint32_t>(), right.GetValueUnsafe<uint32_t>());
	case PhysicalType::UINT64:
		return OP::Operation(left.GetValueUnsafe<uint64_t>(), right.GetValueUnsafe<uint64_t>());
	case PhysicalType::UINT128:
		return OP::Operation(left.GetValueUnsafe<uhugeint_t>(), right.GetValueUnsafe<uhugeint_t>());
	case PhysicalType::INT128:
		return OP::Operation(left.GetValueUnsafe<hugeint_t>(), right.GetValueUnsafe<hugeint_t>());
	case PhysicalType::FLOAT:
		return OP::Operation(left.GetValueUnsafe<float>(), right.GetValueUnsafe<float>());
	case PhysicalType::DOUBLE:
		return OP::Operation(left.GetValueUnsafe<double>(), right.GetValueUnsafe<double>());
	case PhysicalType::INTERVAL:
		return OP::Operation(left.GetValueUnsafe<interval_t>(), right.GetValueUnsafe<interval_t>());
	case PhysicalType::VARCHAR:
		return OP::Operation(StringValue::Get(left), StringValue::Get(right));
	case PhysicalType::STRUCT: {
		auto &left_children = StructValue::GetChildren(left);
		auto &right_children = StructValue::GetChildren(right);
		// this should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());
		idx_t i = 0;
		for (; i < left_children.size() - 1; ++i) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return ValuePositionComparator::Final<OP>(left_children[i], right_children[i]);
	}
	case PhysicalType::LIST: {
		auto &left_children = ListValue::GetChildren(left);
		auto &right_children = ListValue::GetChildren(right);
		for (idx_t pos = 0;; ++pos) {
			if (pos == left_children.size() || pos == right_children.size()) {
				return ValuePositionComparator::TieBreak<OP>(left_children.size(), right_children.size());
			}
			if (ValuePositionComparator::Definite<OP>(left_children[pos], right_children[pos])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[pos], right_children[pos])) {
				return false;
			}
		}
		return false;
	}
	case PhysicalType::ARRAY: {
		auto &left_children = ArrayValue::GetChildren(left);
		auto &right_children = ArrayValue::GetChildren(right);

		// Should be enforced by the type
		D_ASSERT(left_children.size() == right_children.size());

		for (idx_t i = 0; i < left_children.size(); i++) {
			if (ValuePositionComparator::Definite<OP>(left_children[i], right_children[i])) {
				return true;
			}
			if (!ValuePositionComparator::Possible<OP>(left_children[i], right_children[i])) {
				return false;
			}
		}
		return true;
	}
	default:
		throw InternalException("Unimplemented type for value comparison");
	}
}